

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O2

void compute_lookaheads(void)

{
  uint uVar1;
  shorts *psVar2;
  shorts **ppsVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  shorts *psVar9;
  uint *puVar10;
  uint *puVar11;
  
  puVar4 = F;
  ppsVar3 = lookback;
  uVar7 = 0;
  puVar5 = LA;
  uVar6 = (ulong)(uint)lookaheads[nstates];
  if (lookaheads[nstates] < 1) {
    uVar6 = uVar7;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    lVar8 = (long)tokensetsize;
    psVar9 = (shorts *)(ppsVar3 + uVar7);
    while (psVar9 = psVar9->next, psVar9 != (shorts *)0x0) {
      puVar10 = puVar4 + (long)psVar9->value * (long)tokensetsize;
      for (puVar11 = puVar5; puVar11 < puVar5 + lVar8; puVar11 = puVar11 + 1) {
        uVar1 = *puVar10;
        puVar10 = puVar10 + 1;
        *puVar11 = *puVar11 | uVar1;
      }
    }
    puVar5 = puVar5 + lVar8;
  }
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    psVar9 = lookback[uVar7];
    while (psVar9 != (shorts *)0x0) {
      psVar2 = psVar9->next;
      free(psVar9);
      psVar9 = psVar2;
    }
  }
  free(lookback);
  free(F);
  return;
}

Assistant:

void compute_lookaheads()
{
  register int i, n;
  register unsigned *fp1, *fp2, *fp3;
  register shorts *sp, *next;
  register unsigned *rowp;

  rowp = LA;
  n = lookaheads[nstates];
  for (i = 0; i < n; i++)
    {
      fp3 = rowp + tokensetsize;
      for (sp = lookback[i]; sp; sp = sp->next)
	{
	  fp1 = rowp;
	  fp2 = F + tokensetsize * sp->value;
	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
      rowp = fp3;
    }

  for (i = 0; i < n; i++)
    for (sp = lookback[i]; sp; sp = next)
      {
        next = sp->next;
        FREE(sp);
      }

  FREE(lookback);
  FREE(F);
}